

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::ConstantManager::GetSIntConstId(ConstantManager *this,int32_t val)

{
  initializer_list<unsigned_int> __l;
  uint32_t uVar1;
  IRContext *this_00;
  TypeManager *this_01;
  Type *type;
  Constant *c_00;
  Instruction *this_02;
  allocator<unsigned_int> local_55;
  uint local_54;
  iterator local_50;
  size_type local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  Constant *local_28;
  Constant *c;
  Type *sint_type;
  ConstantManager *pCStack_10;
  int32_t val_local;
  ConstantManager *this_local;
  
  sint_type._4_4_ = val;
  pCStack_10 = this;
  this_00 = context(this);
  this_01 = IRContext::get_type_mgr(this_00);
  type = TypeManager::GetSIntType(this_01);
  local_54 = sint_type._4_4_;
  local_50 = &local_54;
  local_48 = 1;
  c = (Constant *)type;
  std::allocator<unsigned_int>::allocator(&local_55);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,__l,&local_55);
  c_00 = GetConstant(this,type,&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
  std::allocator<unsigned_int>::~allocator(&local_55);
  local_28 = c_00;
  this_02 = GetDefiningInstruction(this,c_00,0,(inst_iterator *)0x0);
  uVar1 = opt::Instruction::result_id(this_02);
  return uVar1;
}

Assistant:

uint32_t ConstantManager::GetSIntConstId(int32_t val) {
  Type* sint_type = context()->get_type_mgr()->GetSIntType();
  const Constant* c = GetConstant(sint_type, {static_cast<uint32_t>(val)});
  return GetDefiningInstruction(c)->result_id();
}